

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_pCAL(png_structrp png_ptr,png_charp purpose,png_int_32 X0,png_int_32 X1,int type,
                   int nparams,png_const_charp units,png_charpp params)

{
  png_uint_32 pVar1;
  size_t sVar2;
  size_t length;
  int local_ac;
  png_byte local_a8 [4];
  int i;
  png_byte new_purpose [80];
  png_byte apStack_4e [4];
  png_byte buf [10];
  png_size_tp params_len;
  size_t total_len;
  size_t units_len;
  png_uint_32 purpose_len;
  int nparams_local;
  int type_local;
  png_int_32 X1_local;
  png_int_32 X0_local;
  png_charp purpose_local;
  png_structrp png_ptr_local;
  
  if (3 < type) {
    png_error(png_ptr,"Unrecognized equation type for pCAL chunk");
  }
  pVar1 = png_check_keyword(png_ptr,purpose,local_a8);
  if (pVar1 == 0) {
    png_error(png_ptr,"pCAL: invalid keyword");
  }
  sVar2 = strlen(units);
  length = sVar2 + (long)(int)(uint)(nparams != 0);
  params_len = (png_size_tp)((pVar1 + 1) + length + 10);
  buf._2_8_ = png_malloc(png_ptr,(long)nparams << 3);
  for (local_ac = 0; local_ac < nparams; local_ac = local_ac + 1) {
    sVar2 = strlen(params[local_ac]);
    *(size_t *)(buf._2_8_ + (long)local_ac * 8) =
         sVar2 + (long)(int)(uint)(local_ac != nparams + -1);
    params_len = (png_size_tp)(*(long *)(buf._2_8_ + (long)local_ac * 8) + (long)params_len);
  }
  png_write_chunk_header(png_ptr,0x7043414c,(png_uint_32)params_len);
  png_write_chunk_data(png_ptr,local_a8,(ulong)(pVar1 + 1));
  png_save_int_32(new_purpose + 0x4e,X0);
  png_save_int_32(apStack_4e,X1);
  buf[0] = (png_byte)type;
  buf[1] = (png_byte)nparams;
  png_write_chunk_data(png_ptr,new_purpose + 0x4e,10);
  png_write_chunk_data(png_ptr,(png_const_bytep)units,length);
  for (local_ac = 0; local_ac < nparams; local_ac = local_ac + 1) {
    png_write_chunk_data
              (png_ptr,(png_const_bytep)params[local_ac],*(size_t *)(buf._2_8_ + (long)local_ac * 8)
              );
  }
  png_free(png_ptr,(png_voidp)buf._2_8_);
  png_write_chunk_end(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_write_pCAL(png_structrp png_ptr, png_charp purpose, png_int_32 X0,
    png_int_32 X1, int type, int nparams, png_const_charp units,
    png_charpp params)
{
   png_uint_32 purpose_len;
   size_t units_len, total_len;
   png_size_tp params_len;
   png_byte buf[10];
   png_byte new_purpose[80];
   int i;

   png_debug1(1, "in png_write_pCAL (%d parameters)", nparams);

   if (type >= PNG_EQUATION_LAST)
      png_error(png_ptr, "Unrecognized equation type for pCAL chunk");

   purpose_len = png_check_keyword(png_ptr, purpose, new_purpose);

   if (purpose_len == 0)
      png_error(png_ptr, "pCAL: invalid keyword");

   ++purpose_len; /* terminator */

   png_debug1(3, "pCAL purpose length = %d", (int)purpose_len);
   units_len = strlen(units) + (nparams == 0 ? 0 : 1);
   png_debug1(3, "pCAL units length = %d", (int)units_len);
   total_len = purpose_len + units_len + 10;

   params_len = (png_size_tp)png_malloc(png_ptr,
       (png_alloc_size_t)((png_alloc_size_t)nparams * (sizeof (size_t))));

   /* Find the length of each parameter, making sure we don't count the
    * null terminator for the last parameter.
    */
   for (i = 0; i < nparams; i++)
   {
      params_len[i] = strlen(params[i]) + (i == nparams - 1 ? 0 : 1);
      png_debug2(3, "pCAL parameter %d length = %lu", i,
          (unsigned long)params_len[i]);
      total_len += params_len[i];
   }

   png_debug1(3, "pCAL total length = %d", (int)total_len);
   png_write_chunk_header(png_ptr, png_pCAL, (png_uint_32)total_len);
   png_write_chunk_data(png_ptr, new_purpose, purpose_len);
   png_save_int_32(buf, X0);
   png_save_int_32(buf + 4, X1);
   buf[8] = (png_byte)type;
   buf[9] = (png_byte)nparams;
   png_write_chunk_data(png_ptr, buf, 10);
   png_write_chunk_data(png_ptr, (png_const_bytep)units, (size_t)units_len);

   for (i = 0; i < nparams; i++)
   {
      png_write_chunk_data(png_ptr, (png_const_bytep)params[i], params_len[i]);
   }

   png_free(png_ptr, params_len);
   png_write_chunk_end(png_ptr);
}